

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trie.hpp
# Opt level: O1

bool __thiscall CppJieba::Trie::dispose(Trie *this)

{
  bool bVar1;
  string local_38;
  
  if (this->_initFlag == true) {
    bVar1 = _deleteNode(this,this->_root);
    if (bVar1) {
      this->_root = (TrieNode *)0x0;
      std::vector<CppJieba::TrieNodeInfo,_std::allocator<CppJieba::TrieNodeInfo>_>::_M_erase_at_end
                (&this->_nodeInfoVec,
                 (this->_nodeInfoVec).
                 super__Vector_base<CppJieba::TrieNodeInfo,_std::allocator<CppJieba::TrieNodeInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start);
      this->_initFlag = false;
    }
    else {
      local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"_deleteNode failed!","");
      Limonp::Logger::LoggingF(4,"Trie.hpp",0x75,&local_38);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p != &local_38.field_2) {
        operator_delete(local_38._M_dataplus._M_p);
      }
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool dispose()
            {
                if(!_getInitFlag())
                {
                    return false;
                }
                bool ret = _deleteNode(_root);
                if(!ret)
                {
                    LogFatal("_deleteNode failed!");
                    return false;
                }
                _root = NULL;
                _nodeInfoVec.clear();

                _setInitFlag(false);
                return ret;
            }